

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O3

Result wallet::CheckFeeRate
                 (CWallet *wallet,CMutableTransaction *mtx,CFeeRate *newFeerate,int64_t maxTxSize,
                 CAmount old_fee,vector<bilingual_str,_std::allocator<bilingual_str>_> *errors)

{
  pointer pCVar1;
  Chain *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  CAmount CVar7;
  CAmount CVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CTxIn *txin;
  pointer __args;
  Result RVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  uint32_t num_bytes;
  long in_FS_OFFSET;
  undefined1 auVar11 [12];
  CFeeRate incrementalRelayFee;
  vector<COutPoint,_std::allocator<COutPoint>_> reused_inputs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  CFeeRate local_200;
  vector<COutPoint,_std::allocator<COutPoint>_> local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  string local_198;
  string local_178;
  long *local_158;
  long local_150;
  long local_148 [2];
  long *local_138;
  long local_130;
  long local_128 [2];
  string local_118;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (wallet->m_chain == (Chain *)0x0) {
LAB_00259b39:
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)maxTxSize;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)old_fee;
  lVar6 = (**(code **)(*(long *)wallet->m_chain + 0xe8))();
  if (newFeerate->nSatoshisPerK < lVar6) {
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               "New fee rate (%s) is lower than the minimum fee rate (%s) to get into the mempool -- "
               ,"");
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,local_d8._M_p,local_d8._M_p + local_d0);
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_d8._M_p,local_d8._M_p + local_d0);
    FormatMoney_abi_cxx11_((string *)local_f8,newFeerate->nSatoshisPerK);
    FormatMoney_abi_cxx11_(&local_118,lVar6);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_78,(tinyformat *)local_b8,(bilingual_str *)local_f8,&local_118,args_1);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (errors,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    RVar9 = WALLET_ERROR;
  }
  else {
    local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (COutPoint *)0x0;
    local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (COutPoint *)0x0;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::reserve
              (&local_1f8,
               ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    __args = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar1 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__args != pCVar1) {
      do {
        if (local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<COutPoint,std::allocator<COutPoint>>::_M_realloc_insert<COutPoint_const&>
                    ((vector<COutPoint,std::allocator<COutPoint>> *)&local_1f8,
                     (iterator)
                     local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                     super__Vector_impl_data._M_finish,&__args->prevout);
        }
        else {
          (local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->n = (__args->prevout).n;
          uVar3 = *(undefined8 *)
                   (__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar4 = *(undefined8 *)
                   ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          uVar5 = *(undefined8 *)
                   ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          *(undefined8 *)
           (((local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).m_wrapped.super_base_blob<256U>.m_data.
            _M_elems + 0x10) =
               *(undefined8 *)
                ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          *(undefined8 *)
           (((local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).m_wrapped.super_base_blob<256U>.m_data.
            _M_elems + 0x18) = uVar5;
          *(undefined8 *)
           ((local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish)->hash).m_wrapped.super_base_blob<256U>.m_data.
           _M_elems = uVar3;
          *(undefined8 *)
           (((local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).m_wrapped.super_base_blob<256U>.m_data.
            _M_elems + 8) = uVar4;
          local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        __args = __args + 1;
      } while (__args != pCVar1);
    }
    pCVar2 = wallet->m_chain;
    if (pCVar2 == (Chain *)0x0) goto LAB_00259b39;
    auVar11 = (**(code **)(*(long *)pCVar2 + 0xc0))(pCVar2,&local_1f8,newFeerate);
    if ((auVar11 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      local_138 = local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,
                 "Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions."
                 ,"");
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_138,local_130 + (long)local_138);
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_138,local_130 + (long)local_138);
      tinyformat::format<>(&local_78,(bilingual_str *)local_b8);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (errors,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
        operator_delete(local_78.translated._M_dataplus._M_p,
                        local_78.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
        operator_delete(local_78.original._M_dataplus._M_p,
                        local_78.original.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
    }
    num_bytes = (uint32_t)maxTxSize;
    CVar7 = CFeeRate::GetFee(newFeerate,num_bytes);
    if ((auVar11 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00259ff9;
    }
    if (wallet->m_chain == (Chain *)0x0) goto LAB_00259b39;
    local_200.nSatoshisPerK = (**(code **)(*(long *)wallet->m_chain + 0xf8))();
    CVar8 = CFeeRate::GetFee(&local_200,num_bytes);
    lVar6 = CVar7 + auVar11._0_8_;
    if (lVar6 < CVar8 + old_fee) {
      local_158 = local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,
                 "Insufficient total fee %s, must be at least %s (oldFee %s + incrementalFee %s)",""
                );
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_158,local_150 + (long)local_158);
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_158,local_150 + (long)local_158);
      FormatMoney_abi_cxx11_((string *)local_f8,lVar6);
      FormatMoney_abi_cxx11_(&local_118,CVar8 + old_fee);
      FormatMoney_abi_cxx11_(&local_178,old_fee);
      CVar7 = CFeeRate::GetFee(&local_200,num_bytes);
      FormatMoney_abi_cxx11_(&local_198,CVar7);
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_78,(tinyformat *)local_b8,(bilingual_str *)local_f8,&local_118,&local_178,
                 &local_198,in_stack_fffffffffffffde8);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (errors,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
        operator_delete(local_78.translated._M_dataplus._M_p,
                        local_78.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
        operator_delete(local_78.original._M_dataplus._M_p,
                        local_78.original.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      local_1a8[0] = local_148[0];
      plVar10 = local_158;
      if (local_158 != local_148) {
LAB_00259937:
        operator_delete(plVar10,local_1a8[0] + 1);
      }
LAB_0025993f:
      RVar9 = INVALID_PARAMETER;
    }
    else {
      CVar7 = GetRequiredFee(wallet,num_bytes);
      if (lVar6 < CVar7) {
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b8,
                   "Insufficient total fee (cannot be less than required fee %s)","");
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_1b8,local_1b0 + (long)local_1b8);
        local_98._M_p = (pointer)&local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_1b8,local_1b0 + (long)local_1b8);
        FormatMoney_abi_cxx11_((string *)local_f8,CVar7);
        tinyformat::format<std::__cxx11::string>
                  (&local_78,(tinyformat *)local_b8,(bilingual_str *)local_f8,args);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (errors,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
          operator_delete(local_78.translated._M_dataplus._M_p,
                          local_78.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
          operator_delete(local_78.original._M_dataplus._M_p,
                          local_78.original.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
        plVar10 = local_1b8;
        if (local_1b8 != local_1a8) goto LAB_00259937;
        goto LAB_0025993f;
      }
      CVar7 = wallet->m_default_max_tx_fee;
      RVar9 = OK;
      if (CVar7 < lVar6) {
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,
                   "Specified or calculated fee %s is too high (cannot be higher than -maxtxfee %s)"
                   ,"");
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_1d8,local_1d0 + (long)local_1d8);
        local_98._M_p = (pointer)&local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_1d8,local_1d0 + (long)local_1d8);
        FormatMoney_abi_cxx11_((string *)local_f8,lVar6);
        FormatMoney_abi_cxx11_(&local_118,CVar7);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_78,(tinyformat *)local_b8,(bilingual_str *)local_f8,&local_118,args_1);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (errors,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
          operator_delete(local_78.translated._M_dataplus._M_p,
                          local_78.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
          operator_delete(local_78.original._M_dataplus._M_p,
                          local_78.original.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        RVar9 = WALLET_ERROR;
      }
    }
    if (local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar9;
  }
LAB_00259ff9:
  __stack_chk_fail();
}

Assistant:

static feebumper::Result CheckFeeRate(const CWallet& wallet, const CMutableTransaction& mtx, const CFeeRate& newFeerate, const int64_t maxTxSize, CAmount old_fee, std::vector<bilingual_str>& errors)
{
    // check that fee rate is higher than mempool's minimum fee
    // (no point in bumping fee if we know that the new tx won't be accepted to the mempool)
    // This may occur if the user set fee_rate or paytxfee too low, if fallbackfee is too low, or, perhaps,
    // in a rare situation where the mempool minimum fee increased significantly since the fee estimation just a
    // moment earlier. In this case, we report an error to the user, who may adjust the fee.
    CFeeRate minMempoolFeeRate = wallet.chain().mempoolMinFee();

    if (newFeerate.GetFeePerK() < minMempoolFeeRate.GetFeePerK()) {
        errors.push_back(strprintf(
            Untranslated("New fee rate (%s) is lower than the minimum fee rate (%s) to get into the mempool -- "),
            FormatMoney(newFeerate.GetFeePerK()),
            FormatMoney(minMempoolFeeRate.GetFeePerK())));
        return feebumper::Result::WALLET_ERROR;
    }

    std::vector<COutPoint> reused_inputs;
    reused_inputs.reserve(mtx.vin.size());
    for (const CTxIn& txin : mtx.vin) {
        reused_inputs.push_back(txin.prevout);
    }

    std::optional<CAmount> combined_bump_fee = wallet.chain().calculateCombinedBumpFee(reused_inputs, newFeerate);
    if (!combined_bump_fee.has_value()) {
        errors.push_back(strprintf(Untranslated("Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions.")));
    }
    CAmount new_total_fee = newFeerate.GetFee(maxTxSize) + combined_bump_fee.value();

    CFeeRate incrementalRelayFee = wallet.chain().relayIncrementalFee();

    // Min total fee is old fee + relay fee
    CAmount minTotalFee = old_fee + incrementalRelayFee.GetFee(maxTxSize);

    if (new_total_fee < minTotalFee) {
        errors.push_back(strprintf(Untranslated("Insufficient total fee %s, must be at least %s (oldFee %s + incrementalFee %s)"),
            FormatMoney(new_total_fee), FormatMoney(minTotalFee), FormatMoney(old_fee), FormatMoney(incrementalRelayFee.GetFee(maxTxSize))));
        return feebumper::Result::INVALID_PARAMETER;
    }

    CAmount requiredFee = GetRequiredFee(wallet, maxTxSize);
    if (new_total_fee < requiredFee) {
        errors.push_back(strprintf(Untranslated("Insufficient total fee (cannot be less than required fee %s)"),
            FormatMoney(requiredFee)));
        return feebumper::Result::INVALID_PARAMETER;
    }

    // Check that in all cases the new fee doesn't violate maxTxFee
    const CAmount max_tx_fee = wallet.m_default_max_tx_fee;
    if (new_total_fee > max_tx_fee) {
        errors.push_back(strprintf(Untranslated("Specified or calculated fee %s is too high (cannot be higher than -maxtxfee %s)"),
            FormatMoney(new_total_fee), FormatMoney(max_tx_fee)));
        return feebumper::Result::WALLET_ERROR;
    }

    return feebumper::Result::OK;
}